

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::SamHeaderValidator::ValidateSequenceDictionary(SamHeaderValidator *this)

{
  bool bVar1;
  SamSequenceConstIterator this_00;
  SamSequenceConstIterator seq_00;
  SamSequenceDictionary *in_RDI;
  SamSequence *seq;
  SamSequenceConstIterator seqEnd;
  SamSequenceConstIterator seqIter;
  SamSequenceDictionary *sequences;
  bool isValid;
  SamHeaderValidator *in_stack_000000d0;
  reference in_stack_ffffffffffffffd0;
  bool local_9;
  
  local_9 = ContainsUniqueSequenceNames(in_stack_000000d0);
  this_00 = SamSequenceDictionary::ConstBegin(in_RDI);
  seq_00 = SamSequenceDictionary::ConstEnd(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
         ::operator*((__normal_iterator<const_BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
                      *)&stack0xffffffffffffffe0);
    bVar1 = ValidateSequence((SamHeaderValidator *)this_00._M_current,seq_00._M_current);
    local_9 = (local_9 & bVar1) != 0;
    __gnu_cxx::
    __normal_iterator<const_BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
    ::operator++((__normal_iterator<const_BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return local_9;
}

Assistant:

bool SamHeaderValidator::ValidateSequenceDictionary()
{

    bool isValid = true;

    // check for unique sequence names
    isValid &= ContainsUniqueSequenceNames();

    // iterate over sequences
    const SamSequenceDictionary& sequences = m_header.Sequences;
    SamSequenceConstIterator seqIter = sequences.ConstBegin();
    SamSequenceConstIterator seqEnd = sequences.ConstEnd();
    for (; seqIter != seqEnd; ++seqIter) {
        const SamSequence& seq = (*seqIter);
        isValid &= ValidateSequence(seq);
    }

    // return validation state
    return isValid;
}